

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

double __thiscall HighsDomain::doChangeBound(HighsDomain *this,HighsDomainChange *boundchg)

{
  double newbound;
  int col;
  pointer pdVar1;
  pointer puVar2;
  long lVar3;
  double local_18;
  
  col = boundchg->column;
  lVar3 = (long)col;
  newbound = boundchg->boundval;
  if (boundchg->boundtype == kLower) {
    pdVar1 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_18 = pdVar1[lVar3];
    pdVar1[lVar3] = newbound;
    if ((local_18 == newbound) && (!NAN(local_18) && !NAN(newbound))) {
      return local_18;
    }
    if (this->infeasible_ != false) goto LAB_002a38f0;
    updateActivityLbChange(this,col,local_18,newbound);
  }
  else {
    pdVar1 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_18 = pdVar1[lVar3];
    pdVar1[lVar3] = newbound;
    if ((local_18 == newbound) && (!NAN(local_18) && !NAN(newbound))) {
      return local_18;
    }
    if (this->infeasible_ != false) goto LAB_002a38f0;
    updateActivityUbChange(this,col,local_18,newbound);
  }
  lVar3 = (long)boundchg->column;
LAB_002a38f0:
  puVar2 = (this->changedcolsflags_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2[lVar3] == '\0') {
    puVar2[lVar3] = '\x01';
    std::vector<int,_std::allocator<int>_>::push_back(&this->changedcols_,&boundchg->column);
  }
  return local_18;
}

Assistant:

double HighsDomain::doChangeBound(const HighsDomainChange& boundchg) {
  double oldbound;

  if (boundchg.boundtype == HighsBoundType::kLower) {
    oldbound = col_lower_[boundchg.column];
    col_lower_[boundchg.column] = boundchg.boundval;
    if (oldbound != boundchg.boundval) {
      if (!infeasible_)
        updateActivityLbChange(boundchg.column, oldbound, boundchg.boundval);

      if (!changedcolsflags_[boundchg.column]) {
        changedcolsflags_[boundchg.column] = 1;
        changedcols_.push_back(boundchg.column);
      }
    }
  } else {
    oldbound = col_upper_[boundchg.column];
    col_upper_[boundchg.column] = boundchg.boundval;
    if (oldbound != boundchg.boundval) {
      if (!infeasible_)
        updateActivityUbChange(boundchg.column, oldbound, boundchg.boundval);

      if (!changedcolsflags_[boundchg.column]) {
        changedcolsflags_[boundchg.column] = 1;
        changedcols_.push_back(boundchg.column);
      }
    }
  }

  return oldbound;
}